

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O1

ND_BOOL ShemuBmpStateCheck(ND_UINT8 *Bitmap,ND_UINT64 Size,ND_UINT64 Start,ND_UINT64 Count,
                          ND_UINT8 Flags)

{
  ND_UINT64 NVar1;
  
  if ((Count + Start <= Size && (Count <= Size && (Start < Size && Bitmap != (ND_UINT8 *)0x0))) &&
     (Count != 0)) {
    NVar1 = 0;
    do {
      if ((Bitmap[NVar1 + Start] & Flags) != 0) {
        return '\x01';
      }
      NVar1 = NVar1 + 1;
    } while (Count != NVar1);
  }
  return '\0';
}

Assistant:

ND_BOOL
ShemuBmpStateCheck(
    ND_UINT8 *Bitmap,
    ND_UINT64 Size,
    ND_UINT64 Start,
    ND_UINT64 Count,
    ND_UINT8 Flags
    )
//
// Check if any of the state bytes in the Bitmap has any of the Flags set.
// 
// @returns ND_TRUE if any state byte contains the indicated Flags.
//
{
    ND_UINT64 i;

    if (ND_NULL == Bitmap || Start >= Size || Count > Size || Start + Count > Size)
    {
        return ND_FALSE;
    }

    for (i = 0; i < Count; i++)
    {
        if (Bitmap[Start + i] & Flags)
        {
            return ND_TRUE;
        }
    }

    return ND_FALSE;
}